

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiPayload * ImGui::AcceptDragDropPayload(char *type,ImGuiDragDropFlags flags)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  bool bVar3;
  ImGuiID IVar4;
  ImGuiID IVar5;
  ImGuiWindow *pIVar6;
  ImDrawList *this;
  undefined4 uVar7;
  undefined4 uVar8;
  ImGuiContext *pIVar9;
  int iVar10;
  ImU32 col;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec4 local_48;
  
  pIVar9 = GImGui;
  if (GImGui->DragDropActive == false) {
    __assert_fail("g.DragDropActive",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x2b09,
                  "const ImGuiPayload *ImGui::AcceptDragDropPayload(const char *, ImGuiDragDropFlags)"
                 );
  }
  if ((GImGui->DragDropPayload).DataFrameCount == -1) {
    __assert_fail("payload.DataFrameCount != -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x2b0a,
                  "const ImGuiPayload *ImGui::AcceptDragDropPayload(const char *, ImGuiDragDropFlags)"
                 );
  }
  pIVar6 = GImGui->CurrentWindow;
  if ((type == (char *)0x0) ||
     (iVar10 = strcmp(type,(GImGui->DragDropPayload).DataType), iVar10 == 0)) {
    IVar4 = pIVar9->DragDropAcceptIdPrev;
    IVar5 = pIVar9->DragDropTargetId;
    IVar1 = (pIVar9->DragDropTargetRect).Min;
    IVar2 = (pIVar9->DragDropTargetRect).Max;
    fVar11 = IVar2.x;
    fVar12 = IVar2.y;
    fVar13 = IVar1.x;
    fVar14 = IVar1.y;
    fVar15 = (fVar12 - fVar14) * (fVar11 - fVar13);
    if (fVar15 <= pIVar9->DragDropAcceptIdCurrRectSurface) {
      pIVar9->DragDropAcceptFlags = flags;
      pIVar9->DragDropAcceptIdCurr = IVar5;
      pIVar9->DragDropAcceptIdCurrRectSurface = fVar15;
    }
    (pIVar9->DragDropPayload).Preview = IVar4 == IVar5;
    if (((pIVar9->DragDropSourceFlags | flags) & 0x800U) == 0 && IVar4 == IVar5) {
      this = pIVar6->DrawList;
      local_58.x = fVar13 + -3.5;
      local_58.y = fVar14 + -3.5;
      local_50.y = fVar12 + 3.5;
      local_50.x = fVar11 + 3.5;
      local_48.x = (pIVar9->Style).Colors[0x32].x;
      local_48.y = (pIVar9->Style).Colors[0x32].y;
      uVar7 = (pIVar9->Style).Colors[0x32].z;
      uVar8 = (pIVar9->Style).Colors[0x32].w;
      local_48.w = (pIVar9->Style).Alpha * (float)uVar8;
      local_48.z = (float)uVar7;
      col = ColorConvertFloat4ToU32(&local_48);
      ImDrawList::AddRect(this,&local_58,&local_50,col,0.0,0,2.0);
    }
    pIVar9->DragDropAcceptFrameCount = pIVar9->FrameCount;
    if (IVar4 == IVar5) {
      if (4 < (ulong)(uint)pIVar9->DragDropMouseButton) {
        __assert_fail("button >= 0 && button < ((int)(sizeof(g.IO.MouseDown) / sizeof(*(g.IO.MouseDown))))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                      ,0x1394,"bool ImGui::IsMouseDown(ImGuiMouseButton)");
      }
      bVar3 = (GImGui->IO).MouseDown[(uint)pIVar9->DragDropMouseButton];
      (pIVar9->DragDropPayload).Delivery = (bool)(bVar3 ^ 1);
      if ((((uint)flags >> 10 & 1) != 0) || (bVar3 == false)) {
LAB_0013cc20:
        return &pIVar9->DragDropPayload;
      }
    }
    else {
      (pIVar9->DragDropPayload).Delivery = false;
      if (((uint)flags >> 10 & 1) != 0) goto LAB_0013cc20;
    }
  }
  return (ImGuiPayload *)0x0;
}

Assistant:

const ImGuiPayload* ImGui::AcceptDragDropPayload(const char* type, ImGuiDragDropFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiPayload& payload = g.DragDropPayload;
    IM_ASSERT(g.DragDropActive);                        // Not called between BeginDragDropTarget() and EndDragDropTarget() ?
    IM_ASSERT(payload.DataFrameCount != -1);            // Forgot to call EndDragDropTarget() ?
    if (type != NULL && !payload.IsDataType(type))
        return NULL;

    // Accept smallest drag target bounding box, this allows us to nest drag targets conveniently without ordering constraints.
    // NB: We currently accept NULL id as target. However, overlapping targets requires a unique ID to function!
    const bool was_accepted_previously = (g.DragDropAcceptIdPrev == g.DragDropTargetId);
    ImRect r = g.DragDropTargetRect;
    float r_surface = r.GetWidth() * r.GetHeight();
    if (r_surface <= g.DragDropAcceptIdCurrRectSurface)
    {
        g.DragDropAcceptFlags = flags;
        g.DragDropAcceptIdCurr = g.DragDropTargetId;
        g.DragDropAcceptIdCurrRectSurface = r_surface;
    }

    // Render default drop visuals
    // FIXME-DRAGDROP: Settle on a proper default visuals for drop target.
    payload.Preview = was_accepted_previously;
    flags |= (g.DragDropSourceFlags & ImGuiDragDropFlags_AcceptNoDrawDefaultRect); // Source can also inhibit the preview (useful for external sources that lives for 1 frame)
    if (!(flags & ImGuiDragDropFlags_AcceptNoDrawDefaultRect) && payload.Preview)
        window->DrawList->AddRect(r.Min - ImVec2(3.5f,3.5f), r.Max + ImVec2(3.5f, 3.5f), GetColorU32(ImGuiCol_DragDropTarget), 0.0f, 0, 2.0f);

    g.DragDropAcceptFrameCount = g.FrameCount;
    payload.Delivery = was_accepted_previously && !IsMouseDown(g.DragDropMouseButton); // For extern drag sources affecting os window focus, it's easier to just test !IsMouseDown() instead of IsMouseReleased()
    if (!payload.Delivery && !(flags & ImGuiDragDropFlags_AcceptBeforeDelivery))
        return NULL;

    return &payload;
}